

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O1

void __thiscall Estimate::EKF::CalcEstimate(EKF *this,VectorXd *y)

{
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pPVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  LhsNested pMVar6;
  undefined8 *puVar7;
  Index index;
  ulong uVar8;
  ActualDstType actualDst;
  long lVar9;
  MatrixXd Pyy;
  MatrixXd R;
  MatrixXd K;
  MatrixXd Z;
  MatrixXd Pxy;
  MatrixXd Pbar;
  MatrixXd H;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_110;
  VectorXd *local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_f0;
  void *local_b8 [3];
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_a0;
  void *local_90 [3];
  void *local_78 [3];
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)&this->H_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_110,(DenseStorage<double,__1,__1,__1,_0> *)&this->R_);
  local_f8 = y;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)&this->Phat_);
  local_f0.m_lhs.m_lhs.m_lhs = (LhsNested)&local_60;
  local_f0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_78,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_f0);
  local_f0.m_rhs.m_lhs.m_lhs = (LhsNested)&local_110;
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  local_128.m_cols = 0;
  local_f0.m_lhs.m_lhs.m_lhs = (LhsNested)&local_48;
  local_f0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_60;
  local_f0.m_lhs.m_rhs.m_matrix = (non_const_type)&local_48;
  if ((local_110.m_cols != 0 && local_110.m_rows != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_110.m_cols),0) <
      local_110.m_rows)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = std::ios::widen;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_128,local_110.m_cols * local_110.m_rows,local_110.m_rows,local_110.m_cols);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_128,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_f0,(assign_op<double,_double> *)local_b8);
  local_f0.m_lhs.m_lhs.m_lhs = (LhsNested)local_78;
  local_f0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_128;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_f0);
  local_f0.m_lhs.m_lhs.m_rhs = (RhsNested)(long)this->n_;
  local_f0.m_lhs.m_rhs.m_matrix = local_f0.m_lhs.m_lhs.m_rhs;
  local_f0.m_rhs.m_lhs.m_rhs = (RhsNested)local_b8;
  local_f0.m_rhs.m_rhs.m_matrix = (non_const_type)&local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_90,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
              *)&local_f0);
  local_f0.m_rhs.m_lhs.m_rhs = (RhsNested)&local_110;
  local_f0.m_lhs.m_lhs.m_lhs = (LhsNested)local_90;
  local_f0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_60;
  local_f0.m_lhs.m_rhs.m_matrix = (non_const_type)local_90;
  local_f0.m_rhs.m_lhs.m_lhs = (LhsNested)local_b8;
  local_f0.m_rhs.m_rhs.m_matrix = (non_const_type)local_b8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>,Eigen::internal::assign_op<double,double>>
            (&this->Phat_,&local_f0,(assign_op<double,_double> *)&local_a0,(type)0x0);
  local_a0.m_rhs = local_f8;
  local_a0.m_lhs = (LhsNested)local_b8;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_f0,&local_a0);
  pMVar6 = local_f0.m_lhs.m_lhs.m_lhs;
  if ((DenseStorage<double,__1,__1,__1,_0> *)
      (this->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != (DenseStorage<double,__1,__1,__1,_0> *)local_f0.m_lhs.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_f0.m_lhs.m_lhs.m_rhs,1);
  }
  pdVar3 = (this->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar4 = (this->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar8 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar4) {
    lVar9 = 0;
    do {
      pPVar1 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)((long)pMVar6 + lVar9 * 8);
      dVar5 = *(double *)(pPVar1 + 8);
      pdVar2 = pdVar3 + lVar9;
      *pdVar2 = *(double *)pPVar1;
      pdVar2[1] = dVar5;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar4) {
    do {
      pdVar3[uVar8] = *(double *)((long)pMVar6 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  free(local_f0.m_lhs.m_lhs.m_lhs);
  free(local_90[0]);
  free(local_b8[0]);
  free(local_128.m_data);
  free(local_78[0]);
  free(local_60.m_data);
  free(local_110.m_data);
  free(local_48.m_data);
  return;
}

Assistant:

void EKF::CalcEstimate(Eigen::VectorXd y){

		//extract locals
		Eigen::MatrixXd H = this->H_;
		Eigen::MatrixXd R = this->R_;
		Eigen::MatrixXd Pbar = this->Phat_;

		// find kalman gain
		Eigen::MatrixXd Pxy = Pbar*H.transpose();
		Eigen::MatrixXd Pyy = H*Pbar*H.transpose() + R;
		Eigen::MatrixXd K = Pxy*Pyy.inverse();

		//covariance
		Eigen::MatrixXd Z = Eigen::MatrixXd::Identity(this->n_,this->n_) - K*H;
		this->Phat_ = Z*Pbar*Z.transpose() + K*R*K.transpose();

		//estimate
		this->xhat_ = K*y;


	}